

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::ArchiveIN(ChMatterMeshless *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::fea::ChMatterMeshless>(marchive);
  ChIndexedNodes::ArchiveIN(&this->super_ChIndexedNodes,marchive);
  return;
}

Assistant:

void ChMatterMeshless::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChMatterMeshless>();

    // deserialize the parent class data too
    ChIndexedNodes::ArchiveIN(marchive);

    // deserialize all member data:
    //***TODO
}